

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O0

wchar_t scan_unicode_pattern
                  (char *out,wchar_t *wout,char *u16be,char *u16le,char *pattern,wchar_t mac_nfd)

{
  wchar_t wVar1;
  size_t sVar2;
  char *in_RCX;
  undefined1 *in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  char *in_R8;
  int in_R9D;
  wchar_t ret;
  char *op16le;
  char *op16be;
  wchar_t *owp;
  char *op;
  char *p;
  uint uc;
  wchar_t *in_stack_ffffffffffffff98;
  wchar_t uc_00;
  undefined1 *local_50;
  undefined4 *local_48;
  char *local_40;
  char *local_38;
  uint32_t local_30;
  
  local_30 = 0;
  uc_00 = L'\0';
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  local_38 = in_R8;
  do {
    if ((*local_38 < '0') || ('9' < *local_38)) {
      if ((*local_38 < 'A') || ('F' < *local_38)) {
        if (((in_R9D != 0) && (local_40 == in_RDI)) &&
           (((((local_30 == 0x2194 ||
               ((((((local_30 - 0x219a < 2 || (local_30 == 0x21ae)) || (local_30 - 0x21cd < 3)) ||
                  ((local_30 == 0x2204 || (local_30 == 0x2209)))) || (local_30 == 0x220c)) ||
                (((local_30 == 0x2224 || (local_30 == 0x2226)) ||
                 ((local_30 == 0x2241 ||
                  (((local_30 == 0x2244 || (local_30 == 0x2247)) || (local_30 == 0x2249)))))))))) ||
              (((local_30 == 0x2260 || (local_30 == 0x2262)) || (local_30 - 0x226d < 5)))) ||
             ((((local_30 - 0x2274 < 3 || (local_30 - 0x2278 < 4)) ||
               ((local_30 - 0x2280 < 2 ||
                (((local_30 - 0x2284 < 2 || (local_30 - 0x2288 < 2)) || (local_30 - 0x22ac < 4))))))
              || ((local_30 - 0x22e0 < 4 || (local_30 - 0x22ea < 4)))))) ||
            ((local_30 == 0x1109a || ((local_30 == 0x1109c || (local_30 == 0x110ab)))))))) {
          uc_00 = L'\x01';
        }
        wVar1 = unicode_to_utf16be(in_RCX,uc_00);
        local_50 = local_50 + wVar1;
        sVar2 = unicode_to_utf16le(in_RCX,uc_00);
        in_RCX = in_RCX + sVar2;
        wVar1 = unicode_to_wc(in_stack_ffffffffffffff98,0);
        local_48 = local_48 + wVar1;
        wVar1 = unicode_to_utf8(local_40,local_30);
        local_40 = local_40 + wVar1;
        if (*local_38 == '\0') {
          *local_50 = 0;
          local_50[1] = 0;
          *in_RCX = '\0';
          in_RCX[1] = '\0';
          *local_48 = 0;
          *local_40 = '\0';
          return uc_00;
        }
        local_30 = 0;
      }
      else {
        local_30 = local_30 * 0x10 + *local_38 + -0x37;
      }
    }
    else {
      local_30 = local_30 * 0x10 + *local_38 + -0x30;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static int
scan_unicode_pattern(char *out, wchar_t *wout, char *u16be, char *u16le,
    const char *pattern, int mac_nfd)
{
	unsigned uc = 0;
	const char *p = pattern;
	char *op = out;
	wchar_t *owp = wout;
	char *op16be = u16be;
	char *op16le = u16le;
	int ret = 0;

	for (;;) {
		if (*p >= '0' && *p <= '9')
			uc = (uc << 4) + (*p - '0');
		else if (*p >= 'A' && *p <= 'F')
			uc = (uc << 4) + (*p - 'A' + 0x0a);
		else {
			if (mac_nfd && op == out) {
				/*
				 * These are not converted to NFD on Mac OS.
 				 * U+2000 - U+2FFF
				 * U+F900 - U+FAFF
				 * U+2F800 - U+2FAFF
				 */
				switch (uc) {
				case 0x2194: case 0x219A: case 0x219B:
				case 0x21AE: case 0x21CD: case 0x21CE:
				case 0x21CF: case 0x2204: case 0x2209:
				case 0x220C: case 0x2224: case 0x2226:
				case 0x2241: case 0x2244: case 0x2247:
				case 0x2249: case 0x2260: case 0x2262:
				case 0x226D: case 0x226E: case 0x226F:
				case 0x2270: case 0x2271: case 0x2274:
				case 0x2275: case 0x2276: case 0x2278:
				case 0x2279: case 0x227A: case 0x227B:
				case 0x2280: case 0x2281: case 0x2284:
				case 0x2285: case 0x2288: case 0x2289:
				case 0x22AC: case 0x22AD: case 0x22AE:
				case 0x22AF: case 0x22E0: case 0x22E1:
				case 0x22E2: case 0x22E3: case 0x22EA:
				case 0x22EB: case 0x22EC: case 0x22ED:
				
				/*
				 * Those code points are not converted to
				 * NFD on Mac OS. I do not know the reason
				 * because it is undocumented.
				 *   NFC        NFD
				 *   1109A  ==> 11099 110BA
				 *   1109C  ==> 1109B 110BA
				 *   110AB  ==> 110A5 110BA
				 */
				case 0x1109A: case 0x1109C: case 0x110AB:
					ret = 1;
					break;
				}
			}
			op16be += unicode_to_utf16be(op16be, uc);
			op16le += unicode_to_utf16le(op16le, uc);
			owp += unicode_to_wc(owp, uc);
			op += unicode_to_utf8(op, uc);
			if (!*p) {
				*op16be++ = 0;
				*op16be = 0;
				*op16le++ = 0;
				*op16le = 0;
				*owp = L'\0';
				*op = '\0';
				break;
			}
			uc = 0;
		}
		p++;
	}
	return (ret);
}